

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

int scroll_narrow_side_size_proc(Am_Object *self)

{
  Am_Value *in_value;
  int local_18;
  Am_Widget_Look local_14;
  int size;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  _size = self;
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_14,in_value);
  if (local_14.value == Am_MOTIF_LOOK_val) {
    local_18 = 0x14;
  }
  else if (local_14.value == Am_WINDOWS_LOOK_val) {
    local_18 = 0x10;
  }
  else {
    if (local_14.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    local_18 = 0x10;
  }
  return local_18;
}

Assistant:

Am_Define_Formula(int, scroll_narrow_side_size)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int size = 16; // default
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    size = 20;
    break;

  case Am_WINDOWS_LOOK_val:
    size = 16;
    break;

  case Am_MACINTOSH_LOOK_val:
    size = 16;
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return size;
}